

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O3

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  int extraout_EAX;
  uv_prepare_t *puVar2;
  undefined8 uVar3;
  int iVar4;
  
  puVar2 = (uv_prepare_t *)uv_default_loop();
  iVar4 = 0x30f9a0;
  iVar1 = uv_pipe_init(puVar2,&pipe_handle,0);
  if (iVar1 == 0) {
    puVar2 = (uv_prepare_t *)uv_default_loop();
    iVar4 = 0x30faa8;
    iVar1 = uv_prepare_init();
    if (iVar1 != 0) goto LAB_00165528;
    puVar2 = &prepare_handle;
    iVar4 = 0x165546;
    iVar1 = uv_prepare_start();
    if (iVar1 != 0) goto LAB_0016552d;
    puVar2 = (uv_prepare_t *)uv_default_loop();
    iVar4 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_00165532;
    if (close_cb_called != 2) goto LAB_00165537;
    if (connect_cb_called == 1) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      iVar4 = 0;
      uv_run(uVar3);
      puVar2 = (uv_prepare_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00165541;
    }
  }
  else {
    run_test_pipe_connect_on_prepare_cold_1();
LAB_00165528:
    run_test_pipe_connect_on_prepare_cold_2();
LAB_0016552d:
    run_test_pipe_connect_on_prepare_cold_3();
LAB_00165532:
    run_test_pipe_connect_on_prepare_cold_4();
LAB_00165537:
    run_test_pipe_connect_on_prepare_cold_5();
  }
  run_test_pipe_connect_on_prepare_cold_6();
LAB_00165541:
  run_test_pipe_connect_on_prepare_cold_7();
  if (puVar2 == &prepare_handle) {
    iVar1 = uv_pipe_connect(&conn_req,&pipe_handle,
                            "/path/to/unix/socket/that/really/should/not/be/there",connect_cb);
    return iVar1;
  }
  prepare_cb_cold_1();
  if (iVar4 == -2) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(&prepare_handle,close_cb);
    iVar1 = uv_close(&pipe_handle,close_cb);
    return iVar1;
  }
  connect_cb_cold_1();
  if (puVar2 != (uv_prepare_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 2);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}